

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void setupWorld(World *world)

{
  Sampler *pSVar1;
  Geometry *pGVar2;
  Phong *pPVar3;
  tuple<pm::Geometry_*,_std::default_delete<pm::Geometry>_> tVar4;
  pointer *__ptr;
  _Head_base<0UL,_pm::Material_*,_false> local_68;
  __uniq_ptr_impl<pm::Geometry,_std::default_delete<pm::Geometry>_> local_60;
  _Head_base<0UL,_pm::Material_*,_false> local_58;
  _Head_base<0UL,_pm::Geometry_*,_false> local_50;
  _Head_base<0UL,_pm::Material_*,_false> local_48;
  _Head_base<0UL,_pm::Geometry_*,_false> local_40;
  _Head_base<0UL,_pm::Material_*,_false> local_38;
  _Head_base<0UL,_pm::Geometry_*,_false> local_30;
  
  pSVar1 = &pm::World::createSampler<pm::NRooks,unsigned_int_const&>(world,&NumSamples)->
            super_Sampler;
  (world->viewplane_).width_ = 0x500;
  (world->viewplane_).height_ = 0x2d0;
  (world->viewplane_).samplerState_.sampler_ = pSVar1;
  (world->viewplane_).maxDepth_ = 5;
  pSVar1 = &pm::World::createSampler<pm::Hammersley,unsigned_int_const&>(world,&NumSamples)->
            super_Sampler;
  pGVar2 = (Geometry *)operator_new(0x30);
  pGVar2->type_ = PLANE;
  pGVar2->castShadows_ = true;
  pGVar2->material_ = (Material *)0x0;
  pGVar2->_vptr_Geometry = (_func_int **)&PTR__Geometry_00116808;
  pGVar2[1]._vptr_Geometry = (_func_int **)0x0;
  pGVar2[1].type_ = PLANE;
  pGVar2[1].castShadows_ = false;
  *(undefined3 *)&pGVar2[1].field_0xd = 0;
  pGVar2[1].material_ = (Material *)0x3f800000;
  pPVar3 = (Phong *)operator_new(0xa8);
  pm::Phong::Phong(pPVar3);
  pm::Phong::setCd(pPVar3,1.0,1.0,1.0);
  pm::Phong::setKa(pPVar3,0.25);
  pm::Phong::setKd(pPVar3,0.45);
  pm::BRDF::setSampler(&(pPVar3->ambientBrdf_).super_BRDF,pSVar1);
  pm::BRDF::setSampler(&(pPVar3->diffuseBrdf_).super_BRDF,pSVar1);
  pm::BRDF::setSampler(&(pPVar3->specularBrdf_).super_BRDF,pSVar1);
  pGVar2->material_ = (Material *)pPVar3;
  local_30._M_head_impl = pGVar2;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_30);
  if (local_30._M_head_impl != (Geometry *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Geometry[1])();
  }
  local_30._M_head_impl = (Geometry *)0x0;
  local_38._M_head_impl = (Material *)pPVar3;
  pm::World::addMaterial
            (world,(unique_ptr<pm::Material,_std::default_delete<pm::Material>_> *)&local_38);
  if ((Phong *)local_38._M_head_impl != (Phong *)0x0) {
    (*((Material *)&(local_38._M_head_impl)->_vptr_Material)->_vptr_Material[1])();
  }
  local_38._M_head_impl = (Material *)0x0;
  pGVar2 = (Geometry *)operator_new(0x28);
  pGVar2->type_ = SPHERE;
  pGVar2->castShadows_ = true;
  pGVar2->material_ = (Material *)0x0;
  pGVar2->_vptr_Geometry = (_func_int **)&PTR__Geometry_00116868;
  pGVar2[1]._vptr_Geometry = (_func_int **)0x3f80000000000000;
  pGVar2[1].type_ = PLANE;
  pGVar2[1].castShadows_ = false;
  *(undefined3 *)&pGVar2[1].field_0xd = 0x3f8000;
  pPVar3 = (Phong *)operator_new(0xa8);
  pm::Phong::Phong(pPVar3);
  pm::Phong::setCd(pPVar3,1.0,0.0,0.0);
  pm::Phong::setKa(pPVar3,0.25);
  pm::Phong::setKd(pPVar3,0.65);
  pm::Phong::setKs(pPVar3,0.15);
  pm::Phong::setSpecularExp(pPVar3,32.0);
  pm::BRDF::setSampler(&(pPVar3->ambientBrdf_).super_BRDF,pSVar1);
  pm::BRDF::setSampler(&(pPVar3->diffuseBrdf_).super_BRDF,pSVar1);
  pm::BRDF::setSampler(&(pPVar3->specularBrdf_).super_BRDF,pSVar1);
  pGVar2->material_ = (Material *)pPVar3;
  local_40._M_head_impl = pGVar2;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_40);
  if (local_40._M_head_impl != (Geometry *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Geometry[1])();
  }
  local_40._M_head_impl = (Geometry *)0x0;
  local_48._M_head_impl = (Material *)pPVar3;
  pm::World::addMaterial
            (world,(unique_ptr<pm::Material,_std::default_delete<pm::Material>_> *)&local_48);
  if ((Phong *)local_48._M_head_impl != (Phong *)0x0) {
    (*((Material *)&(local_48._M_head_impl)->_vptr_Material)->_vptr_Material[1])();
  }
  local_48._M_head_impl = (Material *)0x0;
  pGVar2 = (Geometry *)operator_new(0x28);
  pGVar2->type_ = SPHERE;
  pGVar2->castShadows_ = true;
  pGVar2->material_ = (Material *)0x0;
  pGVar2->_vptr_Geometry = (_func_int **)&PTR__Geometry_00116868;
  pGVar2[1]._vptr_Geometry = (_func_int **)0x3f00000040000000;
  pGVar2[1].type_ = PLANE;
  pGVar2[1].castShadows_ = false;
  *(undefined3 *)&pGVar2[1].field_0xd = 0x3f0000;
  pPVar3 = (Phong *)operator_new(0xa8);
  pm::Phong::Phong(pPVar3);
  pm::Phong::setCd(pPVar3,0.0,1.0,0.0);
  pm::Phong::setKa(pPVar3,0.1);
  pm::Phong::setKd(pPVar3,0.45);
  pm::Phong::setKs(pPVar3,0.5);
  pm::Phong::setSpecularExp(pPVar3,32.0);
  pm::BRDF::setSampler(&(pPVar3->ambientBrdf_).super_BRDF,pSVar1);
  pm::BRDF::setSampler(&(pPVar3->diffuseBrdf_).super_BRDF,pSVar1);
  pm::BRDF::setSampler(&(pPVar3->specularBrdf_).super_BRDF,pSVar1);
  pGVar2->material_ = (Material *)pPVar3;
  local_50._M_head_impl = pGVar2;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_50);
  if (local_50._M_head_impl != (Geometry *)0x0) {
    (*(local_50._M_head_impl)->_vptr_Geometry[1])();
  }
  local_50._M_head_impl = (Geometry *)0x0;
  local_58._M_head_impl = (Material *)pPVar3;
  pm::World::addMaterial
            (world,(unique_ptr<pm::Material,_std::default_delete<pm::Material>_> *)&local_58);
  if ((Phong *)local_58._M_head_impl != (Phong *)0x0) {
    (*((Material *)&(local_58._M_head_impl)->_vptr_Material)->_vptr_Material[1])();
  }
  local_58._M_head_impl = (Material *)0x0;
  tVar4.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
  super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>)operator_new(0x28);
  *(undefined4 *)
   ((long)tVar4.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
          super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl + 8) = 1;
  *(undefined1 *)
   ((long)tVar4.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
          super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl + 0xc) = 1;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
                  super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined ***)
   tVar4.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
   super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl = &PTR__Geometry_00116868;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
                  super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl + 0x18) =
       0x40000000c0000000;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
                  super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl + 0x20) =
       0x3f40000000000000;
  pPVar3 = (Phong *)operator_new(0xa8);
  pm::Phong::Phong(pPVar3);
  pm::Phong::setCd(pPVar3,0.0,0.0,1.0);
  pm::Phong::setKa(pPVar3,0.1);
  pm::Phong::setKd(pPVar3,0.75);
  pm::Phong::setKs(pPVar3,0.25);
  pm::Phong::setSpecularExp(pPVar3,24.0);
  pm::BRDF::setSampler(&(pPVar3->ambientBrdf_).super_BRDF,pSVar1);
  pm::BRDF::setSampler(&(pPVar3->diffuseBrdf_).super_BRDF,pSVar1);
  pm::BRDF::setSampler(&(pPVar3->specularBrdf_).super_BRDF,pSVar1);
  *(Phong **)
   ((long)tVar4.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
          super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl + 0x10) = pPVar3;
  local_60._M_t.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
  super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl =
       (tuple<pm::Geometry_*,_std::default_delete<pm::Geometry>_>)
       (tuple<pm::Geometry_*,_std::default_delete<pm::Geometry>_>)
       tVar4.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
       super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl;
  pm::World::addObject
            (world,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_60);
  if ((_Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>)
      local_60._M_t.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
      super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl != (Geometry *)0x0) {
    (**(code **)(*(long *)local_60._M_t.
                          super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>
                          .super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl + 8))();
  }
  local_60._M_t.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
  super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl =
       (tuple<pm::Geometry_*,_std::default_delete<pm::Geometry>_>)
       (_Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>)0x0;
  local_68._M_head_impl = (Material *)pPVar3;
  pm::World::addMaterial
            (world,(unique_ptr<pm::Material,_std::default_delete<pm::Material>_> *)&local_68);
  if ((Phong *)local_68._M_head_impl != (Phong *)0x0) {
    (*((Material *)&(local_68._M_head_impl)->_vptr_Material)->_vptr_Material[1])();
  }
  return;
}

Assistant:

void setupWorld(pm::World &world)
{
	auto vpSampler = world.createSampler<pm::NRooks>(NumSamples);

	world.viewPlane().setDimensions(Width, Height);
	world.viewPlane().setSampler(vpSampler);
	world.viewPlane().editMaxDepth() = 5;

	auto hammersley = world.createSampler<pm::Hammersley>(NumSamples);

#if AMBIENT
	auto ambient = std::make_unique<pm::Ambient>();
	ambient->setRadianceScale(0.01f);
	world.setAmbientLight(std::move(ambient));
#elif AMBIENT_OCCLUSION
	auto multiJittered = world.createSampler<pm::MultiJittered>(64);
	auto ambient = std::make_unique<pm::AmbientOccluder>();
	ambient->setRadianceScale(0.01f);
	ambient->setColor(0.25f, 0.25f, 0.25f);
	ambient->setMinAmount(0.0f);
	ambient->setSampler(multiJittered);
	world.setAmbientLight(std::move(ambient));
#endif

	auto plane = std::make_unique<pm::Plane>(pm::Vector3(0.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 1.0f, 0.0f));
	auto white = std::make_unique<pm::Phong>();
	white->setCd(1.0f, 1.0f, 1.0f);
	white->setKa(0.25f);
	white->setKd(0.45f);
	//white->setKs(0.25f);
	//white->setSpecularExp(32.0f);
	white->ambient().setSampler(hammersley);
	white->diffuse().setSampler(hammersley);
	white->specular().setSampler(hammersley);
	plane->setMaterial(white.get());
	world.addObject(std::move(plane));
	world.addMaterial(std::move(white));

	auto sphere1 = std::make_unique<pm::Sphere>(pm::Vector3(0.0f, 1.0f, 0.0f), 1.0f);
	auto red = std::make_unique<pm::Phong>();
	red->setCd(1.0f, 0.0f, 0.0f);
	red->setKa(0.25f);
	red->setKd(0.65f);
	red->setKs(0.15f);
	red->setSpecularExp(32.0f);
	red->ambient().setSampler(hammersley);
	red->diffuse().setSampler(hammersley);
	red->specular().setSampler(hammersley);
	sphere1->setMaterial(red.get());
	world.addObject(std::move(sphere1));
	world.addMaterial(std::move(red));

	auto sphere2 = std::make_unique<pm::Sphere>(pm::Vector3(2.0f, 0.5f, 0.0f), 0.5f);
	auto green = std::make_unique<pm::Phong>();
	green->setCd(0.0f, 1.0f, 0.0f);
	green->setKa(0.1f);
	green->setKd(0.45f);
	green->setKs(0.5f);
	green->setSpecularExp(32.0f);
	green->ambient().setSampler(hammersley);
	green->diffuse().setSampler(hammersley);
	green->specular().setSampler(hammersley);
	sphere2->setMaterial(green.get());
	world.addObject(std::move(sphere2));
	world.addMaterial(std::move(green));

	auto sphere3 = std::make_unique<pm::Sphere>(pm::Vector3(-2.0f, 2.0f, 0.0f), 0.75f);
	auto blue = std::make_unique<pm::Phong>();
	blue->setCd(0.0f, 0.0f, 1.0f);
	blue->setKa(0.1f);
	blue->setKd(0.75f);
	blue->setKs(0.25f);
	blue->setSpecularExp(24.0f);
	blue->ambient().setSampler(hammersley);
	blue->diffuse().setSampler(hammersley);
	blue->specular().setSampler(hammersley);
	sphere3->setMaterial(blue.get());
	world.addObject(std::move(sphere3));
	world.addMaterial(std::move(blue));

#if POINT_LIGHTS
	auto light1 = std::make_unique<pm::PointLight>(0.0f, 2.0f, -2.0f);
	//light1->setColor(1.0f, 0.0f, 1.0f);
	light1->setRadianceScale(0.1f);
	world.addLight(std::move(light1));

	auto light2 = std::make_unique<pm::PointLight>(3.0f, 3.0f, -2.0f);
	light2->setRadianceScale(0.1f);
	//light2->setCastShadows(false);
	//world.addLight(std::move(light2));

	auto light3 = std::make_unique<pm::PointLight>(-3.0f, 3.0f, -2.0);
	light3->setRadianceScale(0.1f);
	//light3->setColor(0.5f, 1.0f, 0.33f);
	//light3->setCastShadows(false);
	//world.addLight(std::move(light3));

	auto light4 = std::make_unique<pm::Directional>(-1.0f, 1.0f, 0.0f);
	light4->setRadianceScale(0.0001f);
	light4->setColor(0.5f, 1.0f, 0.33f);
	//light4->setCastShadows(false);
	//world.addLight(std::move(light4));
#elif AREA_LIGHTS
	auto emissive = world.createMaterial<pm::Emissive>();
	emissive->setRadianceScale(0.25f);

	auto object = world.createObject<pm::Rectangle>(pm::Vector3(-1.0f, 3.0f, -1.0f), pm::Vector3(2.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 2.0f), pm::Vector3(0.0f, -1.0f, 0.0f));
	object->setSampler(hammersley);
	object->setMaterial(emissive);
	object->setCastShadows(false);
	auto light1 = world.createLight<pm::AreaLight>(object);

	auto object2 = world.createObject<pm::Rectangle>(pm::Vector3(-4.0f, 0.0f, 0.5f), pm::Vector3(0.0f, 1.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 1.0f), pm::Vector3(1.0f, 0.0f, 0.0f));
	object2->setSampler(hammersley);
	object2->setMaterial(emissive);
	object2->setCastShadows(false);
	auto light2 = world.createLight<pm::AreaLight>(object2);

	auto envSampler = world.createSampler<pm::NRooks>(256);
	auto envEmissive = world.createMaterial<pm::Emissive>();
	envEmissive->setRadianceScale(0.1f);
	envEmissive->setCe(1.0f, 1.0f, 0.6f);
	auto envlight = world.createLight<pm::EnvironmentLight>(envEmissive);
	envlight->setSampler(envSampler);
#elif PATH_TRACE
	auto object = std::make_unique<pm::Rectangle>(pm::Vector3(-1.0f, 3.0f, -1.0f), pm::Vector3(2.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 2.0f), pm::Vector3(0.0f, -1.0f, 0.0f));
	object->setSampler(hammersley);
	auto emissive = std::make_unique<pm::Emissive>();
	emissive->setRadianceScale(0.25f);
	//emissive->setCe(1.0f, 0.0f, 0.0f);
	object->setMaterial(emissive.get());
	world.addObject(std::move(object));
	world.addMaterial(std::move(emissive));

	auto object2 = std::make_unique<pm::Rectangle>(pm::Vector3(-4.0f, 0.0f, 0.5f), pm::Vector3(0.0f, 1.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 1.0f), pm::Vector3(1.0f, 0.0f, 0.0f));
	object2->setSampler(hammersley);
	auto emissive2 = std::make_unique<pm::Emissive>();
	emissive2->setRadianceScale(0.2f);
	//emissive2->setCe(1.0f, 0.0f, 0.0f);
	object2->setMaterial(emissive2.get());
	world.addObject(std::move(object2));
	world.addMaterial(std::move(emissive2));
#endif
}